

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O0

void __thiscall
pbrt::GaussianFilter::GaussianFilter
          (GaussianFilter *this,Vector2f *radius,Float sigma,Allocator alloc)

{
  uintptr_t *in_RSI;
  FilterHandle *in_RDI;
  undefined4 in_XMM0_Da;
  Float FVar1;
  int in_stack_000001cc;
  FilterHandle *in_stack_000001d0;
  FilterSampler *in_stack_000001d8;
  Allocator in_stack_000001e0;
  undefined4 in_stack_ffffffffffffffb8;
  Float in_stack_ffffffffffffffbc;
  
  (in_RDI->
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  ).bits = *in_RSI;
  *(undefined4 *)
   &in_RDI[1].
    super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
    .bits = in_XMM0_Da;
  FVar1 = Gaussian((Float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),in_stack_ffffffffffffffbc);
  *(Float *)((long)&in_RDI[1].
                    super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                    .bits + 4) = FVar1;
  FVar1 = Gaussian((Float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),in_stack_ffffffffffffffbc);
  *(Float *)&in_RDI[2].
             super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
             .bits = FVar1;
  FilterHandle::TaggedPointer<pbrt::GaussianFilter>
            (in_RDI,(GaussianFilter *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  FilterSampler::FilterSampler
            (in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001e0);
  return;
}

Assistant:

GaussianFilter(const Vector2f &radius, Float sigma = 0.5f, Allocator alloc = {})
        : radius(radius),
          sigma(sigma),
          expX(Gaussian(radius.x, 0, sigma)),
          expY(Gaussian(radius.y, 0, sigma)),
          sampler(this, 64, alloc) {}